

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O0

void Abc_NtkMfsPowerResub(Mfs_Man_t *p,Mfs_Par_t *pPars)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  float fVar5;
  int nFaninMax;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pFanin;
  int k;
  int i;
  Mfs_Par_t *pPars_local;
  Mfs_Man_t *p_local;
  
  pNtk_00 = p->pNtk;
  iVar1 = Abc_NtkGetFaninMax(p->pNtk);
  for (pFanin._0_4_ = 0; iVar2 = Vec_PtrSize(pNtk_00->vObjs), (int)pFanin < iVar2;
      pFanin._0_4_ = (int)pFanin + 1) {
    pAVar3 = Abc_NtkObj(pNtk_00,(int)pFanin);
    if ((((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) &&
        ((p->pPars->nDepthMax == 0 ||
         ((int)(*(uint *)&pAVar3->field_0x14 >> 0xc) <= p->pPars->nDepthMax)))) &&
       (((iVar2 = Abc_ObjFaninNum(pAVar3), 1 < iVar2 &&
         (iVar2 = Abc_ObjFaninNum(pAVar3), iVar2 <= iVar1)) &&
        (iVar2 = Abc_WinNode(p,pAVar3), iVar2 == 0)))) {
      for (pFanin._4_4_ = 0; iVar2 = Abc_ObjFaninNum(pAVar3), pFanin._4_4_ < iVar2;
          pFanin._4_4_ = pFanin._4_4_ + 1) {
        pAVar4 = Abc_ObjFanin(pAVar3,pFanin._4_4_);
        fVar5 = Abc_MfsObjProb(p,pAVar4);
        if (0.35 <= fVar5) {
          Abc_NtkMfsSolveSatResub(p,pAVar3,pFanin._4_4_,0,0);
        }
      }
    }
  }
  for (pFanin._0_4_ = 0; iVar2 = Vec_PtrSize(pNtk_00->vObjs), (int)pFanin < iVar2;
      pFanin._0_4_ = (int)pFanin + 1) {
    pAVar3 = Abc_NtkObj(pNtk_00,(int)pFanin);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) &&
       (((p->pPars->nDepthMax == 0 ||
         ((int)(*(uint *)&pAVar3->field_0x14 >> 0xc) <= p->pPars->nDepthMax)) &&
        (((iVar2 = Abc_ObjFaninNum(pAVar3), 1 < iVar2 &&
          (iVar2 = Abc_ObjFaninNum(pAVar3), iVar2 <= iVar1)) &&
         (iVar2 = Abc_WinNode(p,pAVar3), iVar2 == 0)))))) {
      for (pFanin._4_4_ = 0; iVar2 = Abc_ObjFaninNum(pAVar3), pFanin._4_4_ < iVar2;
          pFanin._4_4_ = pFanin._4_4_ + 1) {
        pAVar4 = Abc_ObjFanin(pAVar3,pFanin._4_4_);
        fVar5 = Abc_MfsObjProb(p,pAVar4);
        if (0.35 <= fVar5) {
          Abc_NtkMfsSolveSatResub(p,pAVar3,pFanin._4_4_,0,0);
        }
      }
    }
  }
  for (pFanin._0_4_ = 0; iVar2 = Vec_PtrSize(pNtk_00->vObjs), (int)pFanin < iVar2;
      pFanin._0_4_ = (int)pFanin + 1) {
    pAVar3 = Abc_NtkObj(pNtk_00,(int)pFanin);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) &&
       (((p->pPars->nDepthMax == 0 ||
         ((int)(*(uint *)&pAVar3->field_0x14 >> 0xc) <= p->pPars->nDepthMax)) &&
        (((iVar2 = Abc_ObjFaninNum(pAVar3), 1 < iVar2 &&
          (iVar2 = Abc_ObjFaninNum(pAVar3), iVar2 <= iVar1)) &&
         (iVar2 = Abc_WinNode(p,pAVar3), iVar2 == 0)))))) {
      for (pFanin._4_4_ = 0; iVar2 = Abc_ObjFaninNum(pAVar3), pFanin._4_4_ < iVar2;
          pFanin._4_4_ = pFanin._4_4_ + 1) {
        pAVar4 = Abc_ObjFanin(pAVar3,pFanin._4_4_);
        fVar5 = Abc_MfsObjProb(p,pAVar4);
        if (0.2 <= fVar5) {
          Abc_NtkMfsSolveSatResub(p,pAVar3,pFanin._4_4_,1,0);
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMfsPowerResub( Mfs_Man_t * p, Mfs_Par_t * pPars)
{
    int i, k;
    Abc_Obj_t *pFanin, *pNode;
    Abc_Ntk_t *pNtk = p->pNtk;
    int nFaninMax = Abc_NtkGetFaninMax(p->pNtk);

    Abc_NtkForEachNode( pNtk, pNode, k )
    {
        if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
            continue;
        if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax )
            continue;
        if (Abc_WinNode(p, pNode) )  // something wrong
            continue;

        // solve the SAT problem
        // Abc_NtkMfsEdgePower( p, pNode );
        // try replacing area critical fanins
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( Abc_MfsObjProb(p, pFanin) >= 0.35 && Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                continue;
    }

    Abc_NtkForEachNode( pNtk, pNode, k )
    {
        if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
            continue;
        if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax )
            continue;
        if (Abc_WinNode(p, pNode) )  // something wrong
            continue;

        // solve the SAT problem
        // Abc_NtkMfsEdgePower( p, pNode );
        // try replacing area critical fanins
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( Abc_MfsObjProb(p, pFanin) >= 0.35 && Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                continue;
    }

    Abc_NtkForEachNode( pNtk, pNode, k )
    {
        if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
            continue;
        if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax )
            continue;
        if (Abc_WinNode(p, pNode) ) // something wrong
            continue;

        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( Abc_MfsObjProb(p, pFanin) >= 0.2 && Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
                continue;
    }
/*
    Abc_NtkForEachNode( pNtk, pNode, k )
    {
        if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
            continue;
        if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax - 2)
            continue;
        if (Abc_WinNode(p, pNode) ) // something wrong
            continue;

        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( Abc_MfsObjProb(p, pFanin) >= 0.37 && Abc_NtkMfsSolveSatResub2( p, pNode, i, -1 ) )
                continue;
    }
*/
}